

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

int av1_adjust_q_from_delta_q_res(int delta_q_res,int prev_qindex,int curr_qindex)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0x100 - delta_q_res;
  if (curr_qindex < 0x100 - delta_q_res) {
    iVar2 = curr_qindex;
  }
  if (curr_qindex < delta_q_res) {
    iVar2 = delta_q_res;
  }
  iVar2 = iVar2 - prev_qindex;
  iVar3 = -iVar2;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  uVar1 = delta_q_res / 4 + iVar3 & -delta_q_res;
  if (iVar2 < 0) {
    uVar1 = -uVar1;
  }
  iVar2 = uVar1 + prev_qindex;
  if (iVar2 < 2) {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int av1_adjust_q_from_delta_q_res(int delta_q_res, int prev_qindex,
                                  int curr_qindex) {
  curr_qindex = clamp(curr_qindex, delta_q_res, 256 - delta_q_res);
  const int sign_deltaq_index = curr_qindex - prev_qindex >= 0 ? 1 : -1;
  const int deltaq_deadzone = delta_q_res / 4;
  const int qmask = ~(delta_q_res - 1);
  int abs_deltaq_index = abs(curr_qindex - prev_qindex);
  abs_deltaq_index = (abs_deltaq_index + deltaq_deadzone) & qmask;
  int adjust_qindex = prev_qindex + sign_deltaq_index * abs_deltaq_index;
  adjust_qindex = AOMMAX(adjust_qindex, MINQ + 1);
  return adjust_qindex;
}